

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_ln.c
# Opt level: O0

ps_arg_t ** arg_sort(ps_arg_t *defn,int32 n)

{
  ps_arg_t **__base;
  int local_24;
  int32 i;
  ps_arg_t **pos;
  int32 n_local;
  ps_arg_t *defn_local;
  
  __base = (ps_arg_t **)
           __ckd_calloc__((long)n,8,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/cmd_ln.c"
                          ,0x85);
  for (local_24 = 0; local_24 < n; local_24 = local_24 + 1) {
    __base[local_24] = defn + local_24;
  }
  qsort(__base,(long)n,8,cmp_name);
  return __base;
}

Assistant:

static ps_arg_t const **
arg_sort(const ps_arg_t * defn, int32 n)
{
    const ps_arg_t ** pos;
    int32 i;

    pos = (ps_arg_t const **) ckd_calloc(n, sizeof(ps_arg_t *));
    for (i = 0; i < n; ++i)
        pos[i] = &defn[i];
    qsort(pos, n, sizeof(ps_arg_t *), cmp_name);

    return pos;
}